

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxOut(void *handle,int net_type,char *tx_hex_string,uint32_t index,int64_t *value_satoshi,
               char **locking_script)

{
  bool bVar1;
  undefined8 uVar2;
  int64_t iVar3;
  char *pcVar4;
  uint32_t in_ECX;
  ConfidentialTransactionContext *in_RDX;
  int64_t *in_R8;
  undefined8 *in_R9;
  Amount AVar5;
  CfdException *except;
  exception *std_except;
  ConfidentialTxOutReference ref_1;
  ConfidentialTransactionContext tx_1;
  TxOutReference ref;
  TransactionContext tx;
  Script temp_locking_script;
  Amount temp_value;
  bool is_bitcoin;
  AbstractTxOutReference *in_stack_fffffffffffffaa8;
  ConfidentialTxOutReference *in_stack_fffffffffffffab0;
  string *in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffac8;
  CfdError error_code;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  string *in_stack_fffffffffffffad8;
  bool *in_stack_fffffffffffffb08;
  allocator *paVar6;
  string *in_stack_fffffffffffffb10;
  string local_4c8;
  Script local_4a8;
  int64_t local_470;
  undefined1 local_468;
  int64_t local_460;
  undefined1 local_458;
  ConfidentialTxOutReference local_450;
  allocator local_351;
  string local_350 [32];
  ConfidentialTransaction local_330 [3];
  Script local_258;
  int64_t local_220;
  undefined1 local_218;
  int64_t local_210;
  undefined1 local_208;
  AbstractTxOutReference local_200;
  allocator local_1a9;
  string local_1a8 [32];
  Transaction local_188 [2];
  Script local_d0;
  Amount local_98;
  byte local_83;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  undefined8 *local_38;
  int64_t *local_30;
  uint32_t local_24;
  ConfidentialTransactionContext *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffac8 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if (!bVar1) {
    local_83 = 0;
    cfd::capi::ConvertNetType
              ((int)((ulong)in_stack_fffffffffffffb10 >> 0x20),in_stack_fffffffffffffb08);
    cfd::core::Amount::Amount(&local_98);
    cfd::core::Script::Script(&local_d0);
    if ((local_83 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_350,(char *)local_20,&local_351);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (local_20,in_stack_fffffffffffffad8);
      std::__cxx11::string::~string(local_350);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      cfd::core::ConfidentialTransaction::GetTxOut(&local_450,local_330,local_24);
      AVar5 = cfd::core::AbstractTxOutReference::GetValue(&local_450.super_AbstractTxOutReference);
      local_470 = AVar5.amount_;
      local_468 = AVar5.ignore_check_;
      local_460 = local_470;
      local_458 = local_468;
      local_98.amount_ = local_470;
      local_98.ignore_check_ = (bool)local_468;
      cfd::core::AbstractTxOutReference::GetLockingScript(in_stack_fffffffffffffaa8);
      cfd::core::Script::operator=(&local_d0,&local_4a8);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffffab0);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(in_stack_fffffffffffffab0);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)in_stack_fffffffffffffab0);
    }
    else {
      paVar6 = &local_1a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a8,(char *)local_20,paVar6);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)in_stack_fffffffffffffab0,(string *)in_stack_fffffffffffffaa8
                );
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      cfd::core::Transaction::GetTxOut((TxOutReference *)&local_200,local_188,local_24);
      AVar5 = cfd::core::AbstractTxOutReference::GetValue(&local_200);
      local_220 = AVar5.amount_;
      local_218 = AVar5.ignore_check_;
      local_210 = local_220;
      local_208 = local_218;
      local_98.amount_ = local_220;
      local_98.ignore_check_ = (bool)local_218;
      cfd::core::AbstractTxOutReference::GetLockingScript(in_stack_fffffffffffffaa8);
      cfd::core::Script::operator=(&local_d0,&local_258);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffffab0);
      cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x656a07);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_fffffffffffffab0);
    }
    if (local_30 != (int64_t *)0x0) {
      iVar3 = cfd::core::Amount::GetSatoshiValue(&local_98);
      *local_30 = iVar3;
    }
    if (local_38 != (undefined8 *)0x0) {
      cfd::core::Script::GetHex_abi_cxx11_(&local_4c8,&local_d0);
      pcVar4 = cfd::capi::CreateString(in_stack_fffffffffffffb10);
      *local_38 = pcVar4;
      std::__cxx11::string::~string((string *)&local_4c8);
    }
    local_4 = 0;
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffffab0);
    return local_4;
  }
  local_60.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_60.filename = local_60.filename + 1;
  local_60.line = 0xa41;
  local_60.funcname = "CfdGetTxOut";
  cfd::core::logger::warn<>(&local_60,"tx is null or empty.");
  local_82 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Failed to parameter. tx is null or empty.",&local_81);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
             error_code,in_stack_fffffffffffffac0);
  local_82 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxOut(
    void* handle, int net_type, const char* tx_hex_string, uint32_t index,
    int64_t* value_satoshi, char** locking_script) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Amount temp_value;
    Script temp_locking_script;
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      const TxOutReference ref = tx.GetTxOut(index);
      temp_value = ref.GetValue();
      temp_locking_script = ref.GetLockingScript();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      const ConfidentialTxOutReference ref = tx.GetTxOut(index);
      temp_value = ref.GetValue();
      temp_locking_script = ref.GetLockingScript();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (value_satoshi != nullptr) {
      *value_satoshi = temp_value.GetSatoshiValue();
    }
    if (locking_script != nullptr) {
      *locking_script = CreateString(temp_locking_script.GetHex());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}